

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  string *psVar2;
  ostream *poVar3;
  directory_entry local_148;
  directory_entry *local_120;
  directory_entry *entry_1;
  iterator __end1_1;
  iterator __begin1_1;
  string local_f0;
  directory_iterator local_d0;
  iterator *local_c0;
  directory_iterator *__range1_1;
  directory_entry *local_90;
  directory_entry *entry;
  iterator __end1;
  iterator __begin1;
  allocator<char> local_51;
  string local_50;
  directory_iterator local_30;
  iterator *local_20;
  directory_iterator *__range1;
  embedded_filesystem fs;
  
  fs._index._4_4_ = 0;
  __range1 = (directory_iterator *)cmrc::iterate::get_filesystem();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
  local_30 = cmrc::embedded_filesystem::iterate_directory
                       ((embedded_filesystem *)&__range1,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_20 = &local_30;
  join_0x00000010_0x00000000_ = cmrc::detail::directory::iterator::begin(local_20);
  _entry = cmrc::detail::directory::iterator::end(local_20);
  while( true ) {
    bVar1 = cmrc::detail::directory::iterator::operator!=
                      ((iterator *)&__end1._end_iter,(iterator *)&entry);
    if (!bVar1) break;
    cmrc::detail::directory::iterator::operator*
              ((directory_entry *)&__range1_1,(iterator *)&__end1._end_iter);
    local_90 = (directory_entry *)&__range1_1;
    psVar2 = cmrc::directory_entry::filename_abi_cxx11_((directory_entry *)&__range1_1);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)psVar2);
    std::operator<<(poVar3,'\n');
    cmrc::directory_entry::~directory_entry((directory_entry *)&__range1_1);
    cmrc::detail::directory::iterator::operator++((iterator *)&__end1._end_iter);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"subdir_a/subdir_b",
             (allocator<char> *)((long)&__begin1_1._end_iter._M_node + 7));
  local_d0 = cmrc::embedded_filesystem::iterate_directory
                       ((embedded_filesystem *)&__range1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__begin1_1._end_iter._M_node + 7));
  local_c0 = &local_d0;
  join_0x00000010_0x00000000_ = cmrc::detail::directory::iterator::begin(local_c0);
  _entry_1 = cmrc::detail::directory::iterator::end(local_c0);
  while( true ) {
    bVar1 = cmrc::detail::directory::iterator::operator!=
                      ((iterator *)&__end1_1._end_iter,(iterator *)&entry_1);
    if (!bVar1) break;
    cmrc::detail::directory::iterator::operator*(&local_148,(iterator *)&__end1_1._end_iter);
    local_120 = &local_148;
    psVar2 = cmrc::directory_entry::filename_abi_cxx11_(&local_148);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)psVar2);
    std::operator<<(poVar3,'\n');
    cmrc::directory_entry::~directory_entry(&local_148);
    cmrc::detail::directory::iterator::operator++((iterator *)&__end1_1._end_iter);
  }
  return fs._index._4_4_;
}

Assistant:

int main() {
    auto fs = cmrc::iterate::get_filesystem();
    for (auto&& entry : fs.iterate_directory("")) {
        std::cout << entry.filename() << '\n';
    }
    for (auto&& entry : fs.iterate_directory("subdir_a/subdir_b")) {
        std::cout << entry.filename() << '\n';
    }
}